

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTestCanonicalizeFile::Run(ParserTestCanonicalizeFile *this)

{
  int iVar1;
  Test *pTVar2;
  Node *pNVar3;
  State *this_00;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild out: cat in/1 in//2\nbuild in/1: cat\nbuild in/2: cat\n"
            );
  pTVar2 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    this_00 = &(this->super_ParserTest).state;
    path.len_ = 4;
    path.str_ = "in/1";
    pNVar3 = State::LookupNode(this_00,path);
    testing::Test::Check
              (pTVar2,pNVar3 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0x100,"state.LookupNode(\"in/1\")");
    pTVar2 = g_current_test;
    path_00.len_ = 4;
    path_00.str_ = "in/2";
    pNVar3 = State::LookupNode(this_00,path_00);
    testing::Test::Check
              (pTVar2,pNVar3 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0x101,"state.LookupNode(\"in/2\")");
    pTVar2 = g_current_test;
    path_01.len_ = 5;
    path_01.str_ = "in//1";
    pNVar3 = State::LookupNode(this_00,path_01);
    testing::Test::Check
              (pTVar2,pNVar3 == (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0x102,"state.LookupNode(\"in//1\")");
    pTVar2 = g_current_test;
    path_02.len_ = 5;
    path_02.str_ = "in//2";
    pNVar3 = State::LookupNode(this_00,path_02);
    testing::Test::Check
              (pTVar2,pNVar3 == (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0x103,"state.LookupNode(\"in//2\")");
    return;
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(ParserTest, CanonicalizeFile) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build out: cat in/1 in//2\n"
"build in/1: cat\n"
"build in/2: cat\n"));

  EXPECT_TRUE(state.LookupNode("in/1"));
  EXPECT_TRUE(state.LookupNode("in/2"));
  EXPECT_FALSE(state.LookupNode("in//1"));
  EXPECT_FALSE(state.LookupNode("in//2"));
}